

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O1

void __thiscall
OpenMesh::PolyConnectivity::split_edge_copy(PolyConnectivity *this,EdgeHandle _eh,VertexHandle _vh)

{
  Halfedge *pHVar1;
  
  split_edge(this,_eh,_vh);
  pHVar1 = ArrayKernel::halfedge
                     (&this->super_ArrayKernel,
                      (HalfedgeHandle)((int)_eh.super_BaseHandle.idx_ * 2 + 1));
  BaseKernel::copy_all_properties
            ((BaseKernel *)this,(EdgeHandle)_eh.super_BaseHandle.idx_,
             (EdgeHandle)
             ((pHVar1->super_Halfedge_without_prev).next_halfedge_handle_.super_BaseHandle.idx_ >> 1
             ),false);
  return;
}

Assistant:

void PolyConnectivity::split_edge_copy(EdgeHandle _eh, VertexHandle _vh)
{
  // Split the edge (handle is kept!)
  split_edge(_eh, _vh);

  // Navigate to the new edge
  EdgeHandle eh0 = edge_handle( next_halfedge_handle( halfedge_handle(_eh, 1) ) );

  // Copy the property from the original to the new edge
  copy_all_properties(_eh, eh0);
}